

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O1

void __thiscall Js::DebugManager::Close(DebugManager *this)

{
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Close(&this->diagnosticPageAllocator);
  if ((this->pConsoleScope).ptr != (DynamicObject *)0x0) {
    Memory::RecyclerRootPtr<Js::DynamicObject>::Unroot
              (&this->pConsoleScope,this->pThreadContext->recycler);
  }
  ThreadContext::EnsureNoReturnedValueList(this->pThreadContext);
  this->pThreadContext = (ThreadContext *)0x0;
  return;
}

Assistant:

void DebugManager::Close()
    {
        this->diagnosticPageAllocator.Close();

        if (this->pConsoleScope)
        {
            this->pConsoleScope.Unroot(this->pThreadContext->GetRecycler());
        }
#if DBG
        this->pThreadContext->EnsureNoReturnedValueList();
#endif
        this->pThreadContext = nullptr;
    }